

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVM.cpp
# Opt level: O2

void __thiscall NanoVM::push<unsigned_int>(NanoVM *this,uint value)

{
  uchar *puVar1;
  uint64_t uVar2;
  
  uVar2 = (this->cpu).registers[7];
  puVar1 = (uchar *)(uVar2 + 4);
  if (puVar1 < (this->cpu).stackBase + (this->cpu).stackSize) {
    *(uint *)((this->cpu).codeBase + uVar2) = value;
    (this->cpu).registers[7] = (uint64_t)puVar1;
    return;
  }
  this->errorFlag = 0x80;
  return;
}

Assistant:

inline void NanoVM::push(T value) {
	// Check bounds
	if (sizeof(value) + cpu.registers[esp] >= reinterpret_cast<uint64_t>(cpu.stackBase) + cpu.stackSize) {
		// No room in stack.
		// Throw error or reallocate more pages
		errorFlag = STACK_ERROR;
		return;
	}
	// push to stack
	*reinterpret_cast<T*>(cpu.codeBase + cpu.registers[esp]) = value;
	// update stack pointer
	cpu.registers[esp] += sizeof(value);
}